

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytrieinp.c
# Opt level: O2

void tommy_trie_inplace_insert
               (tommy_trie_inplace *trie_inplace,tommy_trie_inplace_node *node,void *data,
               tommy_key_t key)

{
  long lVar1;
  tommy_trie_inplace_node_struct *ptVar2;
  byte bVar3;
  long lVar4;
  tommy_trie_inplace_node_struct *ptVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  node->data = data;
  node->key = key;
  for (lVar4 = 4; lVar4 != 8; lVar4 = lVar4 + 1) {
    node->map[lVar4 + -4] = (tommy_trie_inplace_node_struct *)0x0;
  }
  ptVar5 = (tommy_trie_inplace_node_struct *)(trie_inplace->bucket + (key >> 0x1a));
  bVar3 = 0x1a;
  do {
    ptVar2 = ptVar5->next;
    if (ptVar2 == (tommy_trie_inplace_node_struct *)0x0) {
      node->prev = node;
      node->next = (tommy_trie_inplace_node_struct *)0x0;
LAB_00104990:
      ptVar5->next = node;
      trie_inplace->count = trie_inplace->count + 1;
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
      __stack_chk_fail();
    }
    if (ptVar2->key == key) {
      node->prev = ptVar2->prev;
      ptVar2->prev = node;
      node->next = (tommy_trie_inplace_node_struct *)0x0;
      ptVar5 = node->prev;
      goto LAB_00104990;
    }
    ptVar5 = (tommy_trie_inplace_node_struct *)(ptVar2->map + (key >> (bVar3 & 0x1f) & 3));
    bVar3 = bVar3 - 2;
  } while( true );
}

Assistant:

void tommy_trie_inplace_insert(tommy_trie_inplace* trie_inplace, tommy_trie_inplace_node* node, void* data, tommy_key_t key)
{
	tommy_trie_inplace_node** let_ptr;
	tommy_uint_t i;

	node->data = data;
	node->key = key;
	/* clear the child pointers */
	for (i = 0; i < TOMMY_TRIE_INPLACE_TREE_MAX; ++i)
		node->map[i] = 0;

	let_ptr = &trie_inplace->bucket[key >> TOMMY_TRIE_INPLACE_BUCKET_SHIFT];

	trie_inplace_bucket_insert(TOMMY_TRIE_INPLACE_BUCKET_SHIFT, let_ptr, node, key);

	++trie_inplace->count;
}